

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.c
# Opt level: O2

int main(int argc,char **argv)

{
  char extraout_AL;
  char cVar1;
  FILE *__stream;
  FILE *__stream_00;
  char *pcVar2;
  char *__format;
  long unaff_R12;
  int iVar3;
  
  iVar3 = 1;
  do {
    if (argc <= iVar3) {
      exit_with_help();
      cVar1 = extraout_AL;
LAB_00102a18:
      fprintf(_stderr,"unknown option: -%c\n",(ulong)(uint)(int)cVar1);
      exit_with_help();
LAB_00102a38:
      pcVar2 = argv[unaff_R12];
      __format = "can\'t open input file %s\n";
LAB_00102a7d:
      fprintf(_stderr,__format,pcVar2);
      exit(1);
    }
    unaff_R12 = (long)iVar3;
    pcVar2 = argv[unaff_R12];
    if (*pcVar2 != '-') {
      __stream = fopen(pcVar2,"r");
      if (__stream == (FILE *)0x0) goto LAB_00102a38;
      __stream_00 = fopen(argv[unaff_R12 + 2],"w");
      if (__stream_00 == (FILE *)0x0) {
        pcVar2 = argv[unaff_R12 + 2];
        __format = "can\'t open output file %s\n";
      }
      else {
        model_ = (model *)load_model(argv[unaff_R12 + 1]);
        if (model_ != (model *)0x0) {
          x = (feature_node *)malloc((long)max_nr_attr << 4);
          do_predict((FILE *)__stream,(FILE *)__stream_00);
          free_and_destroy_model(&model_);
          free(line);
          free(x);
          fclose(__stream);
          fclose(__stream_00);
          return 0;
        }
        pcVar2 = argv[unaff_R12 + 1];
        __format = "can\'t open model file %s\n";
        model_ = (model *)0x0;
      }
      goto LAB_00102a7d;
    }
    cVar1 = pcVar2[1];
    if (cVar1 == 'q') {
      info = print_null;
    }
    else {
      if (cVar1 != 'b') goto LAB_00102a18;
      iVar3 = iVar3 + 1;
      flag_predict_probability = atoi(argv[unaff_R12 + 1]);
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
	FILE *input, *output;
	int i;

	// parse options
	for(i=1;i<argc;i++)
	{
		if(argv[i][0] != '-') break;
		++i;
		switch(argv[i-1][1])
		{
			case 'b':
				flag_predict_probability = atoi(argv[i]);
				break;
			case 'q':
				info = &print_null;
				i--;
				break;
			default:
				fprintf(stderr,"unknown option: -%c\n", argv[i-1][1]);
				exit_with_help();
				break;
		}
	}
	if(i>=argc)
		exit_with_help();

	input = fopen(argv[i],"r");
	if(input == NULL)
	{
		fprintf(stderr,"can't open input file %s\n",argv[i]);
		exit(1);
	}

	output = fopen(argv[i+2],"w");
	if(output == NULL)
	{
		fprintf(stderr,"can't open output file %s\n",argv[i+2]);
		exit(1);
	}

	if((model_=load_model(argv[i+1]))==0)
	{
		fprintf(stderr,"can't open model file %s\n",argv[i+1]);
		exit(1);
	}

	x = (struct feature_node *) malloc(max_nr_attr*sizeof(struct feature_node));
	do_predict(input, output);
	free_and_destroy_model(&model_);
	free(line);
	free(x);
	fclose(input);
	fclose(output);
	return 0;
}